

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# voltage.h
# Opt level: O0

void saveVoltageTo(ostream *fs,int r,
                  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                  *ivolt,vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                         *fvolt,
                  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                  *fall)

{
  const_reference pvVar1;
  const_reference pvVar2;
  ostream *poVar3;
  ulong uVar4;
  int local_38;
  int local_34;
  int j;
  int i;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  *fall_local;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  *fvolt_local;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  *ivolt_local;
  int r_local;
  ostream *fs_local;
  
  std::ios_base::setf((ios_base *)(fs + *(long *)(*(long *)fs + -0x18)),_S_fixed);
  std::operator<<(fs,anon_var_dwarf_11da3e);
  for (local_34 = 0; local_34 <= r + -1; local_34 = local_34 + 1) {
    for (local_38 = 0; local_38 < r + -1; local_38 = local_38 + 1) {
      pvVar1 = std::
               vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
               ::operator[](ivolt,(long)local_34);
      pvVar2 = std::vector<float,_std::allocator<float>_>::operator[](pvVar1,(long)local_38);
      poVar3 = (ostream *)std::ostream::operator<<(fs,*pvVar2);
      std::operator<<(poVar3,"\t");
    }
    pvVar1 = std::
             vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
             ::operator[](ivolt,(long)local_34);
    pvVar2 = std::vector<float,_std::allocator<float>_>::operator[](pvVar1,(long)(r + -1));
    poVar3 = (ostream *)std::ostream::operator<<(fs,*pvVar2);
    std::operator<<(poVar3,"\n");
  }
  std::operator<<(fs,anon_var_dwarf_11da49);
  for (local_34 = 0; local_34 <= r + -1; local_34 = local_34 + 1) {
    for (local_38 = 0; local_38 < r + -1; local_38 = local_38 + 1) {
      pvVar1 = std::
               vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
               ::operator[](fvolt,(long)local_34);
      pvVar2 = std::vector<float,_std::allocator<float>_>::operator[](pvVar1,(long)local_38);
      poVar3 = (ostream *)std::ostream::operator<<(fs,*pvVar2);
      std::operator<<(poVar3,"\t");
    }
    pvVar1 = std::
             vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
             ::operator[](fvolt,(long)local_34);
    pvVar2 = std::vector<float,_std::allocator<float>_>::operator[](pvVar1,(long)(r + -1));
    poVar3 = (ostream *)std::ostream::operator<<(fs,*pvVar2);
    std::operator<<(poVar3,"\n");
  }
  std::operator<<(fs,
                  "The potential drops on each resistance are saved in the potential drop matrix..\n"
                 );
  for (local_34 = 0; local_34 <= r + -1; local_34 = local_34 + 1) {
    for (local_38 = 0; local_38 < r + -1; local_38 = local_38 + 1) {
      pvVar1 = std::
               vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
               ::operator[](fall,(long)local_34);
      pvVar2 = std::vector<float,_std::allocator<float>_>::operator[](pvVar1,(long)local_38);
      poVar3 = (ostream *)std::ostream::operator<<(fs,*pvVar2);
      std::operator<<(poVar3,"\t");
    }
    pvVar1 = std::
             vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
             ::operator[](fall,(long)local_34);
    pvVar2 = std::vector<float,_std::allocator<float>_>::operator[](pvVar1,(long)(r + -1));
    poVar3 = (ostream *)std::ostream::operator<<(fs,*pvVar2);
    std::operator<<(poVar3,"\n");
  }
  uVar4 = std::ios::operator!((ios *)(fs + *(long *)(*(long *)fs + -0x18)));
  if ((uVar4 & 1) == 0) {
    printf("\nThe voltage.dat file was written correctly!\n");
  }
  else {
    std::operator<<((ostream *)&std::cout,
                    "\nThere was an error in writing the file \'voltage.dat\'!\n");
  }
  return;
}

Assistant:

inline void
saveVoltageTo(
        std::ostream &fs,
        int r,
        const vector<vector<float>> &ivolt,
        const vector<vector<float>> &fvolt,
        const vector<vector<float>> &fall
)
{
    fs.setf(std::ios::fixed);
    int i,j;

    /*Scrivo su file*/
    fs << "The values ​​obtained for the voltages respect the physical laws\n";
    for(i=0; i<=r-1; i++){
        for(j=0; j<r-1; j++) {
            fs << ivolt[i][j] << "\t";
        }
        fs << ivolt[i][r-1] << "\n";
    }
    fs << "The values ​​of the voltages at the end of the branch are saved in the final voltage matrix.\n";

    for(i=0; i<=r-1; i++){
        for(j=0; j<r-1; j++) {
            fs << fvolt[i][j] << "\t";
        }
        fs << fvolt[i][r-1] << "\n";
    }
    fs << "The potential drops on each resistance are saved in the potential drop matrix..\n";
    for(i=0; i<=r-1; i++){
        for(j=0; j<r-1; j++) {
            fs << fall[i][j] << "\t";
        }
        fs << fall[i][r-1] << "\n";
    }

    if (!fs)
        std::cout << "\nThere was an error in writing the file 'voltage.dat'!\n";
    else
        printf("\nThe voltage.dat file was written correctly!\n");
}